

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O1

void __thiscall TestOutput::printTestRun(TestOutput *this,size_t number,size_t total)

{
  if (1 < total) {
    (*this->_vptr_TestOutput[0xb])(this,"Test run ");
    (*this->_vptr_TestOutput[0xd])(this,number);
    (*this->_vptr_TestOutput[0xb])(this," of ");
    (*this->_vptr_TestOutput[0xd])(this,total);
    (*this->_vptr_TestOutput[0xb])(this,"\n");
    return;
  }
  return;
}

Assistant:

void TestOutput::printTestRun(size_t number, size_t total)
{
    if (total > 1) {
        print("Test run ");
        print(number);
        print(" of ");
        print(total);
        print("\n");
    }
}